

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdLoad.c
# Opt level: O1

int CmdCommandLoad(Abc_Frame_t *pAbc,int argc,char **argv)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  uint *__ptr;
  void *pvVar4;
  size_t sVar5;
  FILE *__stream;
  uint uVar6;
  undefined8 uVar7;
  uint uVar8;
  ulong uVar9;
  char *pcVar10;
  uint *puVar11;
  long lVar12;
  ulong uVar13;
  
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 100;
  __ptr[1] = 0;
  pvVar4 = malloc(100);
  *(void **)(__ptr + 2) = pvVar4;
  uVar6 = 100;
  uVar9 = 0;
  do {
    cVar1 = "abccmd_"[uVar9];
    if (uVar9 == uVar6) {
      if ((int)uVar6 < 0x10) {
        if (pvVar4 == (void *)0x0) {
          pvVar4 = malloc(0x10);
        }
        else {
          pvVar4 = realloc(pvVar4,0x10);
        }
        uVar6 = 0x10;
      }
      else {
        uVar8 = uVar6 * 2;
        if (SBORROW4(uVar6,uVar8) != 0 < (int)uVar6) {
          uVar6 = uVar8;
          if (pvVar4 == (void *)0x0) {
            pvVar4 = malloc((ulong)uVar8);
          }
          else {
            pvVar4 = realloc(pvVar4,(ulong)uVar8);
          }
        }
      }
    }
    *(char *)((long)pvVar4 + uVar9) = cVar1;
    uVar9 = uVar9 + 1;
  } while (uVar9 != 7);
  __ptr[1] = 7;
  *__ptr = uVar6;
  *(void **)(__ptr + 2) = pvVar4;
  pcVar10 = *argv;
  sVar5 = strlen(pcVar10);
  if (0 < (int)(uint)sVar5) {
    uVar6 = *__ptr;
    uVar8 = __ptr[1];
    pvVar4 = *(void **)(__ptr + 2);
    uVar9 = 0;
    do {
      cVar1 = pcVar10[uVar9];
      if ((int)uVar9 + uVar8 == uVar6) {
        if ((int)uVar6 < 0x10) {
          if (pvVar4 == (void *)0x0) {
            pvVar4 = malloc(0x10);
          }
          else {
            pvVar4 = realloc(pvVar4,0x10);
          }
          uVar6 = 0x10;
        }
        else {
          uVar2 = uVar6 * 2;
          if (SBORROW4(uVar6,uVar2) != 0 < (int)uVar6) {
            uVar6 = uVar2;
            if (pvVar4 == (void *)0x0) {
              pvVar4 = malloc((ulong)uVar2);
            }
            else {
              pvVar4 = realloc(pvVar4,(ulong)uVar2);
            }
          }
        }
      }
      *(char *)((long)pvVar4 + uVar9 + (long)(int)uVar8) = cVar1;
      uVar9 = uVar9 + 1;
    } while (((uint)sVar5 & 0x7fffffff) != uVar9);
    __ptr[1] = uVar8 + (int)uVar9;
    *__ptr = uVar6;
    *(void **)(__ptr + 2) = pvVar4;
  }
  uVar6 = *__ptr;
  uVar8 = __ptr[1];
  pvVar4 = *(void **)(__ptr + 2);
  lVar12 = 0;
  do {
    cVar1 = "capo.exe"[lVar12 + 4];
    if (uVar8 + (int)lVar12 == uVar6) {
      if ((int)uVar6 < 0x10) {
        if (pvVar4 == (void *)0x0) {
          pvVar4 = malloc(0x10);
        }
        else {
          pvVar4 = realloc(pvVar4,0x10);
        }
        uVar6 = 0x10;
      }
      else {
        uVar2 = uVar6 * 2;
        if (SBORROW4(uVar6,uVar2) != 0 < (int)uVar6) {
          uVar6 = uVar2;
          if (pvVar4 == (void *)0x0) {
            pvVar4 = malloc((ulong)uVar2);
          }
          else {
            pvVar4 = realloc(pvVar4,(ulong)uVar2);
          }
        }
      }
    }
    *(char *)((long)pvVar4 + lVar12 + (int)uVar8) = cVar1;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  __ptr[1] = uVar8 + 4;
  *__ptr = uVar6;
  *(void **)(__ptr + 2) = pvVar4;
  if (uVar8 + 4 == uVar6) {
    if ((int)uVar6 < 0x10) {
      if (*(void **)(__ptr + 2) == (void *)0x0) {
        pvVar4 = malloc(0x10);
      }
      else {
        pvVar4 = realloc(*(void **)(__ptr + 2),0x10);
      }
      uVar8 = 0x10;
    }
    else {
      uVar8 = uVar6 * 2;
      if (SBORROW4(uVar6,uVar8) == 0 < (int)uVar6) goto LAB_002bcd2f;
      if (*(void **)(__ptr + 2) == (void *)0x0) {
        pvVar4 = malloc((ulong)uVar8);
      }
      else {
        pvVar4 = realloc(*(void **)(__ptr + 2),(ulong)uVar8);
      }
    }
    *(void **)(__ptr + 2) = pvVar4;
    *__ptr = uVar8;
  }
LAB_002bcd2f:
  uVar6 = __ptr[1];
  __ptr[1] = uVar6 + 1;
  *(undefined1 *)(*(long *)(__ptr + 2) + (long)(int)uVar6) = 0;
  __stream = fopen(*(char **)(__ptr + 2),"r");
  if (__stream == (FILE *)0x0) {
    if (*(void **)(__ptr + 2) != (void *)0x0) {
      free(*(void **)(__ptr + 2));
      __ptr[2] = 0;
      __ptr[3] = 0;
    }
    puVar11 = __ptr;
    free(__ptr);
    iVar3 = (int)puVar11;
    uVar7 = *(undefined8 *)(__ptr + 2);
    pcVar10 = "Cannot run the binary \"%s\".\n\n";
    goto LAB_002bcfdd;
  }
  fclose(__stream);
  if ((int)__ptr[1] < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecStr.h"
                  ,0x249,"char Vec_StrPop(Vec_Str_t *)");
  }
  __ptr[1] = __ptr[1] - 1;
  if (1 < argc) {
    uVar9 = 1;
    do {
      uVar6 = __ptr[1];
      uVar8 = *__ptr;
      pvVar4 = *(void **)(__ptr + 2);
      if (uVar6 == uVar8) {
        if ((int)uVar8 < 0x10) {
          if (pvVar4 == (void *)0x0) {
            pvVar4 = malloc(0x10);
          }
          else {
            pvVar4 = realloc(pvVar4,0x10);
          }
          sVar5 = 0x10;
        }
        else {
          sVar5 = (ulong)uVar8 * 2;
          if ((int)sVar5 <= (int)uVar8) goto LAB_002bcdd3;
          if (pvVar4 == (void *)0x0) {
            pvVar4 = malloc(sVar5);
          }
          else {
            pvVar4 = realloc(pvVar4,sVar5);
          }
        }
      }
      else {
LAB_002bcdd3:
        sVar5 = (size_t)uVar8;
      }
      *(undefined1 *)((long)pvVar4 + (long)(int)uVar6) = 0x20;
      __ptr[1] = uVar6 + 1;
      *__ptr = (uint)sVar5;
      *(void **)(__ptr + 2) = pvVar4;
      pcVar10 = argv[uVar9];
      sVar5 = strlen(pcVar10);
      if (0 < (int)(uint)sVar5) {
        uVar6 = *__ptr;
        uVar8 = __ptr[1];
        pvVar4 = *(void **)(__ptr + 2);
        uVar13 = 0;
        do {
          cVar1 = pcVar10[uVar13];
          if (uVar8 + (int)uVar13 == uVar6) {
            if ((int)uVar6 < 0x10) {
              if (pvVar4 == (void *)0x0) {
                pvVar4 = malloc(0x10);
              }
              else {
                pvVar4 = realloc(pvVar4,0x10);
              }
              uVar6 = 0x10;
            }
            else {
              uVar2 = uVar6 * 2;
              if (SBORROW4(uVar6,uVar2) != 0 < (int)uVar6) {
                uVar6 = uVar2;
                if (pvVar4 == (void *)0x0) {
                  pvVar4 = malloc((ulong)uVar2);
                }
                else {
                  pvVar4 = realloc(pvVar4,(ulong)uVar2);
                }
              }
            }
          }
          *(char *)((long)pvVar4 + uVar13 + (long)(int)uVar8) = cVar1;
          uVar13 = uVar13 + 1;
        } while (((uint)sVar5 & 0x7fffffff) != uVar13);
        __ptr[1] = (int)uVar13 + uVar8;
        *__ptr = uVar6;
        *(void **)(__ptr + 2) = pvVar4;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != (uint)argc);
  }
  uVar6 = *__ptr;
  if (__ptr[1] == uVar6) {
    if ((int)uVar6 < 0x10) {
      if (*(void **)(__ptr + 2) == (void *)0x0) {
        pvVar4 = malloc(0x10);
      }
      else {
        pvVar4 = realloc(*(void **)(__ptr + 2),0x10);
      }
      sVar5 = 0x10;
    }
    else {
      sVar5 = (ulong)uVar6 * 2;
      if ((int)sVar5 <= (int)uVar6) goto LAB_002bcf85;
      if (*(void **)(__ptr + 2) == (void *)0x0) {
        pvVar4 = malloc(sVar5);
      }
      else {
        pvVar4 = realloc(*(void **)(__ptr + 2),sVar5);
      }
    }
    *(void **)(__ptr + 2) = pvVar4;
    *__ptr = (uint)sVar5;
  }
LAB_002bcf85:
  uVar6 = __ptr[1];
  __ptr[1] = uVar6 + 1;
  *(undefined1 *)(*(long *)(__ptr + 2) + (long)(int)uVar6) = 0;
  pcVar10 = *(char **)(__ptr + 2);
  iVar3 = Util_SignalSystem(pcVar10);
  if (iVar3 == 0) {
    if (pcVar10 != (char *)0x0) {
      free(pcVar10);
      __ptr[2] = 0;
      __ptr[3] = 0;
    }
    free(__ptr);
    return 0;
  }
  if (pcVar10 != (char *)0x0) {
    free(pcVar10);
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  puVar11 = __ptr;
  free(__ptr);
  iVar3 = (int)puVar11;
  Abc_Print(iVar3,"The following command has returned non-zero exit status:\n");
  uVar7 = *(undefined8 *)(__ptr + 2);
  pcVar10 = "\"%s\"\n";
LAB_002bcfdd:
  Abc_Print(iVar3,pcVar10,uVar7);
  return 1;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function********************************************************************

  Synopsis    []

  Description []

  SideEffects []

  SeeAlso     []

******************************************************************************/
int CmdCommandLoad( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Vec_Str_t * vCommand;
    FILE * pFile;
    int i;
    vCommand = Vec_StrAlloc( 100 );
    Vec_StrAppend( vCommand, "abccmd_" );
    Vec_StrAppend( vCommand, argv[0] );
    Vec_StrAppend( vCommand, ".exe" );
    Vec_StrPush( vCommand, 0 );
    // check if there is the binary
    if ( (pFile = fopen( Vec_StrArray(vCommand), "r" )) == NULL )
    {
        Vec_StrFree( vCommand );
        Abc_Print( -1, "Cannot run the binary \"%s\".\n\n", Vec_StrArray(vCommand) );
        return 1;
    }
    fclose( pFile );
    Vec_StrPop( vCommand );
    // add other arguments
    for ( i = 1; i < argc; i++ )
    {
        Vec_StrAppend( vCommand, " " );
        Vec_StrAppend( vCommand, argv[i] );
    }
    Vec_StrPush( vCommand, 0 );
    // run the command line
    if ( Util_SignalSystem( Vec_StrArray(vCommand) ) )
    {
        Vec_StrFree( vCommand );
        Abc_Print( -1, "The following command has returned non-zero exit status:\n" );
        Abc_Print( -1, "\"%s\"\n", Vec_StrArray(vCommand) );
        return 1;
    }
    Vec_StrFree( vCommand );
    return 0;
}